

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O0

bool vkt::pipeline::isVertexFormatUfloat(VkFormat format)

{
  bool local_9;
  VkFormat format_local;
  
  local_9 = format == VK_FORMAT_B10G11R11_UFLOAT_PACK32 ||
            format == VK_FORMAT_E5B9G9R9_UFLOAT_PACK32;
  return local_9;
}

Assistant:

bool isVertexFormatUfloat (VkFormat format)
{
	switch (format)
	{
		case VK_FORMAT_B10G11R11_UFLOAT_PACK32:
		case VK_FORMAT_E5B9G9R9_UFLOAT_PACK32:
			return true;

		default:
			break;
	}

	return false;

}